

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-quadratic.cpp
# Opt level: O0

double foo(VectorXd *x,VectorXd *grad)

{
  Index IVar1;
  RealScalar RVar2;
  double f;
  int i;
  VectorXd d;
  int n;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff08;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffff20;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_ffffffffffffff28;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff30;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff38;
  StorageBaseType *in_stack_ffffffffffffff50;
  double *scalar;
  undefined4 local_2c;
  
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff10
                    );
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  for (local_2c = 0; local_2c < (int)IVar1; local_2c = local_2c + 1) {
    in_stack_ffffffffffffff28 =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
          *)(double)local_2c;
    in_stack_ffffffffffffff30 =
         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                   (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08);
    *(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      **)in_stack_ffffffffffffff30 = in_stack_ffffffffffffff28;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)in_stack_ffffffffffffff30);
  scalar = (double *)0x4000000000000000;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Eigen::operator*(scalar,in_stack_ffffffffffffff50);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::noalias(in_stack_ffffffffffffff08);
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> *)
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x10265a);
  return RVar2;
}

Assistant:

double foo(const VectorXd& x, VectorXd& grad)
{
    const int n = x.size();
    VectorXd d(n);
    for(int i = 0; i < n; i++)
        d[i] = i;

    double f = (x - d).squaredNorm();
    grad.noalias() = 2.0 * (x - d);
    return f;
}